

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMImage * MT32Emu::ROMImage::makeROMImage(File *file1,File *file2)

{
  ROMImage *romImage1;
  ROMImage *romImage2;
  ROMImage *pRVar1;
  
  getROMInfoLists();
  romImage1 = makeROMImage(file1,getROMInfoLists::PARTIAL_ROM_INFOS);
  romImage2 = makeROMImage(file2,getROMInfoLists::PARTIAL_ROM_INFOS);
  if ((romImage1->romInfo == (ROMInfo *)0x0) || (romImage2->romInfo == (ROMInfo *)0x0)) {
    pRVar1 = (ROMImage *)0x0;
  }
  else {
    pRVar1 = mergeROMImages(romImage1,romImage2);
  }
  freeROMImage(romImage1);
  freeROMImage(romImage2);
  return pRVar1;
}

Assistant:

const ROMImage *ROMImage::makeROMImage(File *file1, File *file2) {
	const ROMInfo * const *partialROMInfos = getROMInfoLists().partialROMInfos.romInfos;
	const ROMImage *image1 = makeROMImage(file1, partialROMInfos);
	const ROMImage *image2 = makeROMImage(file2, partialROMInfos);
	const ROMImage *fullImage = image1->getROMInfo() == NULL || image2->getROMInfo() == NULL ? NULL : mergeROMImages(image1, image2);
	freeROMImage(image1);
	freeROMImage(image2);
	return fullImage;
}